

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O1

int space_mixer_start(mixed_segment *segment)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar3 = (ulong)*(byte *)((long)segment->data + 0x542c);
  bVar5 = uVar3 == 0;
  if (!bVar5) {
    plVar1 = *(long **)((long)segment->data + 0x10);
    if (*plVar1 != 0) {
      uVar2 = 1;
      do {
        uVar4 = uVar2;
        if (uVar3 == uVar4) {
          bVar5 = uVar3 <= uVar4;
          goto LAB_0014420d;
        }
        uVar2 = uVar4 + 1;
      } while (plVar1[uVar4] != 0);
      bVar5 = uVar3 <= uVar4;
    }
    mixed_err(0x16);
  }
LAB_0014420d:
  return (int)bVar5;
}

Assistant:

int space_mixer_start(struct mixed_segment *segment){
  struct space_mixer_data *data = (struct space_mixer_data *)segment->data;
  for(int i=0; i<data->channels.count; ++i){
    if(!data->out[i]){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  return 1;
}